

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io.c
# Opt level: O0

void gdPutInt(int w,gdIOCtx *ctx)

{
  gdIOCtx *ctx_local;
  int w_local;
  
  (*ctx->putC)(ctx,(int)((uint)w >> 0x18));
  (*ctx->putC)(ctx,(int)((uint)w >> 0x10));
  (*ctx->putC)(ctx,(int)((uint)w >> 8));
  (*ctx->putC)(ctx,(int)w);
  return;
}

Assistant:

void gdPutInt (int w, gdIOCtx *ctx)
{
	IO_DBG(printf("Putting int...\n"));
	(ctx->putC)(ctx, (unsigned char) (w >> 24));
	(ctx->putC)(ctx, (unsigned char) ((w >> 16) & 0xFF));
	(ctx->putC)(ctx, (unsigned char) ((w >> 8) & 0xFF));
	(ctx->putC)(ctx, (unsigned char) (w & 0xFF));
	IO_DBG(printf("put.\n"));
}